

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O1

bignum __thiscall jbcoin::generateRootDeterministicKey(jbcoin *this,uint128 *seed)

{
  int iVar1;
  BIGNUM *pBVar2;
  array<unsigned_char,_20UL> *extraout_RDX;
  array<unsigned_char,_20UL> *args;
  array<unsigned_char,_20UL> *extraout_RDX_00;
  array<unsigned_char,_20UL> *extraout_RDX_01;
  uint32_t seq;
  array<unsigned_char,_20UL> buf;
  result_type root;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  result_type local_40;
  
  pBVar2 = BN_new();
  *(BIGNUM **)this = pBVar2;
  if (pBVar2 != (BIGNUM *)0x0) {
    local_5c = 0;
    args = extraout_RDX;
    do {
      do {
        local_58 = *(undefined8 *)seed->pn;
        uStack_50 = *(undefined8 *)(seed->pn + 2);
        local_48 = (undefined1)((uint)local_5c >> 0x18);
        local_47 = (undefined1)((uint)local_5c >> 0x10);
        local_46 = (undefined1)((uint)local_5c >> 8);
        local_45 = (undefined1)local_5c;
        local_5c = local_5c + 1;
        sha512Half<std::array<unsigned_char,20ul>>(&local_40,(jbcoin *)&local_58,args);
        beast::secure_erase<void>((jbcoin *)&local_58,0x14);
        openssl::bignum::assign((bignum *)this,(uint8_t *)&local_40,0x20);
        beast::secure_erase<void>(&local_40,0x20);
        iVar1 = BN_is_zero(*(undefined8 *)this);
        args = extraout_RDX_00;
      } while (iVar1 != 0);
      iVar1 = BN_cmp(*(BIGNUM **)this,DAT_002e49e0);
      args = extraout_RDX_01;
    } while (-1 < iVar1);
    beast::secure_erase<void>(&local_5c,4);
    return (bignum)(BIGNUM *)this;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"BN_new() failed");
}

Assistant:

static bignum generateRootDeterministicKey (uint128 const& seed)
{
    // find non-zero private key less than the curve's order
    bignum privKey;
    std::uint32_t seq = 0;

    do
    {
        // buf: 0                seed               16  seq  20
        //      |<--------------------------------->|<------>|
        std::array<std::uint8_t, 20> buf;
        std::copy(seed.begin(), seed.end(), buf.begin());
        copy_uint32 (buf.begin() + 16, seq++);
        auto root = sha512Half(buf);
        beast::secure_erase(buf.data(), buf.size());
        privKey.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (privKey.is_zero() || privKey >= secp256k1curve.order);
    beast::secure_erase(&seq, sizeof(seq));
    return privKey;
}